

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void AttributeChecks(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  CheckAttribs *pCVar2;
  Bool BVar3;
  bool bVar4;
  
  do {
    if (node == (Node *)0x0) {
      return;
    }
    pNVar1 = node->next;
    BVar3 = prvTidynodeIsElement(node);
    if (BVar3 != no) {
      if ((node->tag == (Dict *)0x0) ||
         (pCVar2 = node->tag->chkattrs, pCVar2 == (CheckAttribs *)0x0)) {
        prvTidyCheckAttributes(doc,node);
      }
      else {
        (*pCVar2)(doc,node);
      }
    }
    if (node->content != (Node *)0x0) {
      AttributeChecks(doc,node->content);
    }
    bVar4 = pNVar1 != node;
    node = pNVar1;
  } while (bVar4);
  __assert_fail("next != node",
                "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/parser.c",
                0x168b,"void AttributeChecks(TidyDocImpl *, Node *)");
}

Assistant:

static void AttributeChecks(TidyDocImpl* doc, Node* node)
{
    Node *next;

    while (node)
    {
        next = node->next;

        if (TY_(nodeIsElement)(node))
        {
            if (node->tag && node->tag->chkattrs) /* [i_a]2 fix crash after adding SVG support with alt/unknown tag subtree insertion there */
                node->tag->chkattrs(doc, node);
            else
                TY_(CheckAttributes)(doc, node);
        }

        if (node->content)
            AttributeChecks(doc, node->content);

        assert( next != node ); /* http://tidy.sf.net/issue/1603538 */
        node = next;
    }
}